

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLineNurbs.cpp
# Opt level: O1

void __thiscall chrono::geometry::ChLineNurbs::ArchiveOUT(ChLineNurbs *this,ChArchiveOut *marchive)

{
  ChNameValue<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>
  local_38;
  
  ChArchiveOut::VersionWrite<chrono::geometry::ChLineNurbs>(marchive);
  ChLine::ArchiveOUT(&this->super_ChLine,marchive);
  local_38._value = &this->points;
  local_38._name = "points";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChVector<double>>(marchive,&local_38);
  local_38._value =
       (vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *)&this->p;
  local_38._name = "p";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[3])(marchive,&local_38);
  return;
}

Assistant:

void ChLineNurbs::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLineNurbs>();
    // serialize parent class
    ChLine::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(points);
    ////marchive << CHNVP(weights); //**TODO MATRIX DESERIALIZATION
    ////marchive << CHNVP(knots); //**TODO MATRIX DESERIALIZATION
    marchive << CHNVP(p);
}